

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::lts_20240722::Cord::RemovePrefix(Cord *this,size_t n)

{
  size_t sVar1;
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordzInfo *info;
  CordRep *rep_00;
  CordRepBtree *pCVar2;
  CordRep *rep_01;
  CordRepSubstring *pCVar3;
  ulong uVar4;
  CordRep *old;
  CordzUpdateScope scope;
  undefined1 local_e8 [32];
  string death_message;
  AlphaNum local_a8;
  AlphaNum local_78;
  AlphaNum local_48;
  
  sVar1 = InlineRep::size(&this->contents_);
  if (sVar1 < n) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&death_message,"Check n <= size() failed: ",(allocator<char> *)&scope);
    _scope = NullSafeStringView("Requested prefix size ");
    AlphaNum::AlphaNum(&local_48,n);
    local_a8.piece_ = NullSafeStringView(" exceeds Cord\'s size ");
    sVar1 = InlineRep::size(&this->contents_);
    AlphaNum::AlphaNum(&local_78,sVar1);
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)local_e8,(AlphaNum *)&scope,&local_48,&local_a8);
    std::__cxx11::string::append((string *)&death_message);
    std::__cxx11::string::~string((string *)local_e8);
    (*raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
               ,0x2a6,&death_message);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2a6,"void absl::Cord::RemovePrefix(size_t)");
  }
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  rep = InlineRep::tree(&this->contents_);
  if (rep == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    InlineRep::remove_prefix(&this->contents_,n);
    return;
  }
  info = cord_internal::InlineData::cordz_info((InlineData *)this);
  cord_internal::CordzUpdateScope::CordzUpdateScope(&scope,info,kRemovePrefix);
  rep_00 = cord_internal::RemoveCrcNode(rep);
  uVar4 = rep_00->length;
  if (n < uVar4) {
    if (rep_00->tag == '\x01') {
      if ((rep_00->refcount).count_.super___atomic_base<int>._M_i == 2) {
        pCVar3 = cord_internal::CordRep::substring(rep_00);
        pCVar3->start = pCVar3->start + n;
        rep_00->length = rep_00->length - n;
        rep_01 = rep_00;
        goto LAB_00111e8d;
      }
      uVar4 = rep_00->length;
    }
    else if (rep_00->tag == '\x03') {
      pCVar2 = cord_internal::CordRep::btree(rep_00);
      rep_01 = (CordRep *)absl::lts_20240722::cord_internal::CordRepBtree::SubTree((ulong)pCVar2,n);
      cord_internal::CordRep::Unref(rep_00);
      goto LAB_00111e8d;
    }
    rep_01 = cord_internal::CordRepSubstring::Substring(rep_00,n,uVar4 - n);
    cord_internal::CordRep::Unref(rep_00);
  }
  else {
    cord_internal::CordRep::Unref(rep_00);
    rep_01 = (Nullable<CordRep_*>)0x0;
  }
LAB_00111e8d:
  InlineRep::SetTreeOrEmpty(&this->contents_,rep_01,&scope);
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&scope);
  return;
}

Assistant:

void Cord::RemovePrefix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested prefix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.remove_prefix(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemovePrefix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      CordRep* old = tree;
      tree = tree->btree()->SubTree(n, tree->length - n);
      CordRep::Unref(old);
    } else if (tree->IsSubstring() && tree->refcount.IsOne()) {
      tree->substring()->start += n;
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, n, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}